

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpTcpEventLoop.cpp
# Opt level: O1

void __thiscall sznet::net::KcpTcpEventLoop::handleNewUdpMessage(KcpTcpEventLoop *this)

{
  size_type *psVar1;
  Buffer *this_00;
  _Rb_tree_header *p_Var2;
  _Rb_tree_header *p_Var3;
  pointer pcVar4;
  void *pvVar5;
  char *pcVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  _Rb_tree_color _Var10;
  int32_t secretId;
  KcpConnection *this_01;
  undefined8 *puVar11;
  mapped_type *pmVar12;
  mapped_type *pmVar13;
  sockaddr *addr;
  LogStream *pLVar14;
  _Base_ptr p_Var15;
  _Base_ptr p_Var16;
  _Base_ptr p_Var17;
  sz_sock sock;
  char **ppcVar18;
  int v;
  SourceFile file;
  SourceFile file_00;
  undefined1 auStack_1058 [8];
  char buf [256];
  char *local_a8;
  anon_union_28_2_62076933_for_InetAddress_1 local_88;
  undefined4 uStack_6c;
  undefined1 local_60 [8];
  string connName;
  KcpConnectionPtr kcpConn;
  uint32_t conv;
  
  bVar9 = EventLoop::isInLoopThread(&this->super_EventLoop);
  if (!bVar9) {
    EventLoop::abortNotInLoopThread(&this->super_EventLoop);
  }
  if ((this->m_inputBuffer).m_writerIndex - (this->m_inputBuffer).m_readerIndex != 8) {
    file._8_8_ = 0x13;
    file.m_data = "KcpTcpEventLoop.cpp";
    Logger::Logger((Logger *)auStack_1058,file,0xa4,ERROR);
    if (0x12 < (uint)((int)&stack0xffffffffffffff58 - (int)local_a8)) {
      builtin_strncpy(local_a8,"who are you! from ",0x12);
      local_a8 = local_a8 + 0x12;
    }
    local_88._0_2_ = (this->m_curRecvAddr).sin_family;
    local_88._2_2_ = (this->m_curRecvAddr).sin_port;
    local_88._4_4_ = (this->m_curRecvAddr).sin_addr;
    uVar7 = *(undefined8 *)(this->m_curRecvAddr).sin_zero;
    local_88._8_4_ = (undefined4)uVar7;
    local_88._12_4_ = (undefined4)((ulong)uVar7 >> 0x20);
    InetAddress::toIpPort_abi_cxx11_((string *)local_60,(InetAddress *)&local_88.m_addr);
    if (connName._M_dataplus._M_p < (pointer)(long)((int)&stack0xffffffffffffff58 - (int)local_a8))
    {
      memcpy(local_a8,(void *)local_60,(size_t)connName._M_dataplus._M_p);
      local_a8 = local_a8 + (long)connName._M_dataplus._M_p;
    }
    if (local_60 != (undefined1  [8])&connName._M_string_length) {
      operator_delete((void *)local_60);
    }
    Logger::~Logger((Logger *)auStack_1058);
    return;
  }
  this_00 = &this->m_inputBuffer;
  _Var10 = Buffer::peekInt32(this_00);
  Buffer::retrieve(this_00,4);
  kcpConn.super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._4_4_ = _Var10;
  secretId = Buffer::peekInt32(this_00);
  Buffer::retrieve(this_00,4);
  p_Var2 = &(this->m_tcpConnections)._M_t._M_impl.super__Rb_tree_header;
  p_Var15 = (this->m_tcpConnections)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var16 = &p_Var2->_M_header;
  for (; p_Var15 != (_Base_ptr)0x0; p_Var15 = (&p_Var15->_M_left)[bVar9]) {
    bVar9 = p_Var15[1]._M_color <
            kcpConn.super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi._4_4_;
    if (!bVar9) {
      p_Var16 = p_Var15;
    }
  }
  p_Var15 = &p_Var2->_M_header;
  if (((_Rb_tree_header *)p_Var16 != p_Var2) &&
     (p_Var15 = p_Var16,
     kcpConn.super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
     _M_pi._4_4_ < p_Var16[1]._M_color)) {
    p_Var15 = &p_Var2->_M_header;
  }
  p_Var3 = &(this->m_crypts)._M_t._M_impl.super__Rb_tree_header;
  p_Var16 = (this->m_crypts)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var17 = &p_Var3->_M_header;
  for (; p_Var16 != (_Base_ptr)0x0; p_Var16 = (&p_Var16->_M_left)[bVar9]) {
    bVar9 = p_Var16[1]._M_color <
            kcpConn.super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi._4_4_;
    if (!bVar9) {
      p_Var17 = p_Var16;
    }
  }
  p_Var16 = &p_Var3->_M_header;
  if (((_Rb_tree_header *)p_Var17 != p_Var3) &&
     (p_Var16 = p_Var17,
     kcpConn.super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
     _M_pi._4_4_ < p_Var17[1]._M_color)) {
    p_Var16 = &p_Var3->_M_header;
  }
  if ((_Rb_tree_header *)p_Var15 == p_Var2) {
    v = 1;
  }
  else if (*(int *)((long)&p_Var15[1]._M_parent[1]._M_right + 4) == 2) {
    if ((_Rb_tree_header *)p_Var16 != p_Var3) {
      bVar9 = *(int *)&p_Var16[1].field_0x4 == secretId;
      v = (uint)!bVar9 << 2;
      goto LAB_0012eb1d;
    }
    v = 3;
  }
  else {
    v = 2;
  }
  bVar9 = false;
LAB_0012eb1d:
  if (bVar9) {
    p_Var2 = &(this->m_kcpConnections)._M_t._M_impl.super__Rb_tree_header;
    p_Var15 = (this->m_kcpConnections)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var16 = &p_Var2->_M_header;
    for (; p_Var15 != (_Base_ptr)0x0; p_Var15 = (&p_Var15->_M_left)[bVar9]) {
      bVar9 = p_Var15[1]._M_color <
              kcpConn.super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi._4_4_;
      if (!bVar9) {
        p_Var16 = p_Var15;
      }
    }
    p_Var15 = &p_Var2->_M_header;
    if (((_Rb_tree_header *)p_Var16 != p_Var2) &&
       (p_Var15 = p_Var16,
       kcpConn.super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount
       ._M_pi._4_4_ < p_Var16[1]._M_color)) {
      p_Var15 = &p_Var2->_M_header;
    }
    if ((_Rb_tree_header *)p_Var15 == p_Var2) {
      InetAddress::toIpPort_abi_cxx11_((string *)local_60,&this->m_udpLisetenAddr);
      snprintf(auStack_1058,0x100,"-kcp-%s#%d",local_60,
               (ulong)kcpConn.
                      super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi._4_4_);
      psVar1 = &connName._M_string_length;
      if (local_60 != (undefined1  [8])psVar1) {
        operator_delete((void *)local_60);
      }
      pcVar4 = (this->m_name)._M_dataplus._M_p;
      local_60 = (undefined1  [8])psVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_60,pcVar4,pcVar4 + (this->m_name)._M_string_length);
      std::__cxx11::string::append((char *)local_60);
      this_01 = (KcpConnection *)operator_new(0x1f0);
      KcpConnection::KcpConnection
                (this_01,&this->super_EventLoop,(this->m_udpSocket).m_sockfd,secretId,
                 (string *)local_60,
                 kcpConn.super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi._4_4_,false,this->m_kcpMode);
      std::__shared_ptr<sznet::net::KcpConnection,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<sznet::net::KcpConnection,void>
                ((__shared_ptr<sznet::net::KcpConnection,(__gnu_cxx::_Lock_policy)2> *)
                 (connName.field_2._M_local_buf + 8),this_01);
      uVar8 = connName.field_2._8_8_;
      *(undefined4 *)(connName.field_2._8_8_ + 0x44) = 3;
      local_88._0_2_ = (this->m_curRecvAddr).sin_family;
      local_88._2_2_ = (this->m_curRecvAddr).sin_port;
      local_88._4_4_ = (this->m_curRecvAddr).sin_addr;
      uVar7 = *(undefined8 *)(this->m_curRecvAddr).sin_zero;
      local_88._8_4_ = (undefined4)uVar7;
      local_88._12_4_ = (undefined4)((ulong)uVar7 >> 0x20);
      puVar11 = (undefined8 *)operator_new(0x1c);
      *(ulong *)((long)puVar11 + 0xc) = CONCAT44(local_88._16_4_,local_88._12_4_);
      *(ulong *)((long)puVar11 + 0x14) = CONCAT44(local_88.m_addr6.sin6_scope_id,local_88._20_4_);
      *puVar11 = local_88._0_8_;
      puVar11[1] = CONCAT44(local_88._12_4_,local_88._8_4_);
      pvVar5 = *(void **)(uVar8 + 0x48);
      *(undefined8 **)(uVar8 + 0x48) = puVar11;
      if (pvVar5 != (void *)0x0) {
        operator_delete(pvVar5);
      }
      KcpConnection::newKCP((KcpConnection *)connName.field_2._8_8_);
      pmVar12 = std::
                map<unsigned_int,_std::shared_ptr<sznet::net::KcpConnection>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::KcpConnection>_>_>_>
                ::operator[](&this->m_kcpConnections,
                             (key_type *)
                             ((long)&kcpConn.
                                     super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi + 4));
      (pmVar12->super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (element_type *)connName.field_2._8_8_;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(pmVar12->
                  super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)&kcpConn);
      std::function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&)>::operator=
                ((function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&)> *)
                 (connName.field_2._8_8_ + 0x50),&this->m_kcpConnectionCallback);
      std::
      function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp)>
      ::operator=((function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp)>
                   *)(connName.field_2._8_8_ + 0x70),&this->m_kcpMessageCallback);
      std::function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&)>::operator=
                ((function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&)> *)
                 (connName.field_2._8_8_ + 0x90),&this->m_kcpWriteCompleteCallback);
      uVar7 = connName.field_2._8_8_;
      local_88._0_8_ = 0;
      local_88._8_4_ = 0;
      local_88._12_4_ = 0;
      local_88._16_4_ = 0;
      local_88._20_4_ = 0;
      local_88.m_addr6.sin6_scope_id = 0;
      uStack_6c = 0;
      local_88._0_8_ = operator_new(0x18);
      *(code **)local_88._0_8_ = removeKcpConnectionInLoop;
      *(undefined8 *)(local_88._0_8_ + 8) = 0;
      *(KcpTcpEventLoop **)(local_88._0_8_ + 0x10) = this;
      local_88.m_addr6.sin6_scope_id = 0x12ff68;
      uStack_6c = 0;
      local_88._16_4_ = 0x12ff8c;
      local_88._20_4_ = 0;
      std::function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_int)>::operator=
                ((function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_int)> *)
                 (uVar7 + 0xd0),
                 (function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_int)> *)
                 &local_88.m_addr);
      if ((code *)CONCAT44(local_88._20_4_,local_88._16_4_) != (code *)0x0) {
        (*(code *)CONCAT44(local_88._20_4_,local_88._16_4_))(&local_88,&local_88,3);
      }
      pmVar13 = std::__detail::
                _Map_base<sockaddr_in,_std::pair<const_sockaddr_in,_std::shared_ptr<sznet::net::KcpConnection>_>,_std::allocator<std::pair<const_sockaddr_in,_std::shared_ptr<sznet::net::KcpConnection>_>_>,_std::__detail::_Select1st,_sznet::net::KcpTcpEventLoop::sockaddrInKeyEqual,_sznet::net::KcpTcpEventLoop::sockaddrInKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<sockaddr_in,_std::pair<const_sockaddr_in,_std::shared_ptr<sznet::net::KcpConnection>_>,_std::allocator<std::pair<const_sockaddr_in,_std::shared_ptr<sznet::net::KcpConnection>_>_>,_std::__detail::_Select1st,_sznet::net::KcpTcpEventLoop::sockaddrInKeyEqual,_sznet::net::KcpTcpEventLoop::sockaddrInKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&this->m_addrConns,&this->m_curRecvAddr);
      (pmVar13->super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (element_type *)connName.field_2._8_8_;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(pmVar13->
                  super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)&kcpConn);
      if (kcpConn.super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   kcpConn.super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
      }
      if (local_60 != (undefined1  [8])psVar1) {
        operator_delete((void *)local_60);
      }
    }
    local_60._0_4_ = 1;
    sock = (this->m_udpSocket).m_sockfd;
    auStack_1058._0_2_ = (this->m_curRecvAddr).sin_family;
    auStack_1058._2_2_ = (this->m_curRecvAddr).sin_port;
    auStack_1058._4_4_ = (this->m_curRecvAddr).sin_addr;
    buf._0_8_ = *(undefined8 *)(this->m_curRecvAddr).sin_zero;
    addr = sockets::sz_sockaddr_cast((sockaddr_in6 *)auStack_1058);
  }
  else {
    file_00._8_8_ = 0x13;
    file_00.m_data = "KcpTcpEventLoop.cpp";
    Logger::Logger((Logger *)auStack_1058,file_00,0xd0,ERROR);
    if (((int)&stack0xffffffffffffff58 - (int)local_a8 & 0xfffffff0U) != 0) {
      builtin_strncpy(local_a8,"you are hack! [",0xf);
      local_a8 = local_a8 + 0xf;
    }
    pLVar14 = LogStream::operator<<((LogStream *)buf,v);
    ppcVar18 = &(pLVar14->m_buffer).m_cur;
    pcVar6 = (pLVar14->m_buffer).m_cur;
    if (((int)ppcVar18 - (int)pcVar6 & 0xfffffff8U) != 0) {
      builtin_strncpy(pcVar6,"] from ",7);
      *ppcVar18 = *ppcVar18 + 7;
    }
    local_88._0_8_ = *(undefined8 *)&this->m_curRecvAddr;
    uVar7 = *(undefined8 *)(this->m_curRecvAddr).sin_zero;
    local_88._8_4_ = (undefined4)uVar7;
    local_88._12_4_ = (undefined4)((ulong)uVar7 >> 0x20);
    InetAddress::toIpPort_abi_cxx11_((string *)local_60,(InetAddress *)&local_88.m_addr);
    if (connName._M_dataplus._M_p < (pointer)(long)((int)ppcVar18 - (int)*ppcVar18)) {
      memcpy(*ppcVar18,(void *)local_60,(size_t)connName._M_dataplus._M_p);
      *ppcVar18 = *ppcVar18 + (long)connName._M_dataplus._M_p;
    }
    if (local_60 != (undefined1  [8])&connName._M_string_length) {
      operator_delete((void *)local_60);
    }
    Logger::~Logger((Logger *)auStack_1058);
    local_60 = (undefined1  [8])((ulong)(uint)local_60._4_4_ << 0x20);
    sock = (this->m_udpSocket).m_sockfd;
    auStack_1058._0_2_ = (this->m_curRecvAddr).sin_family;
    auStack_1058._2_2_ = (this->m_curRecvAddr).sin_port;
    auStack_1058._4_4_ = (this->m_curRecvAddr).sin_addr;
    buf._0_8_ = *(undefined8 *)(this->m_curRecvAddr).sin_zero;
    addr = sockets::sz_sockaddr_cast((sockaddr_in6 *)auStack_1058);
  }
  sockets::sz_udp_send(sock,local_60,4,addr);
  return;
}

Assistant:

void KcpTcpEventLoop::handleNewUdpMessage()
{
	assertInLoopThread();
	size_t recvSize = m_inputBuffer.readableBytes();
	if (recvSize != (sizeof(uint32_t) + sizeof(int32_t)))
	{
		// 这种情况不予理会
		LOG_ERROR << "who are you! from " << InetAddress(m_curRecvAddr).toIpPort();
		return;
	}
	uint32_t conv = static_cast<uint32_t>(m_inputBuffer.readInt32());
	int32_t secretId = m_inputBuffer.readInt32();
	bool ok = true;
	int inError = 0;
	TcpConnectionMap::iterator fTcpIter = m_tcpConnections.find(conv);
	cryptConvMap::iterator fSecretIter = m_crypts.find(conv);
	do
	{
		if (fTcpIter == m_tcpConnections.end())
		{
			ok = false;
			inError = 1;
			break;
		}

		if (!fTcpIter->second->connected())
		{
			ok = false;
			inError = 2;
			break;
		}

		if (fSecretIter == m_crypts.end())
		{
			ok = false;
			inError = 3;
			break;
		}

		if (fSecretIter->second != secretId)
		{
			ok = false;
			inError = 4;
			break;
		}

		inError = 0;
		ok = true;
	} while (false);
	if (!ok)
	{
		LOG_ERROR << "you are hack! [" << inError << "] from " << InetAddress(m_curRecvAddr).toIpPort();
		// 回执客户端
		checkResponse(ok);
		return;
	}
	KcpConnectionMap::iterator fKcpIter = m_kcpConnections.find(conv);
	if (fKcpIter == m_kcpConnections.end())
	{
		// 创建KcpConnection
		char buf[256];
		snprintf(buf, sizeof(buf), "-kcp-%s#%d", getUdpListenIpPort().c_str(), conv);
		string connName = m_name + buf;
		KcpConnectionPtr kcpConn(new KcpConnection(this, m_udpSocket.fd(), secretId, connName, conv, false, m_kcpMode));
		kcpConn->setState(KcpConnection::StateE::kConnecting);
		kcpConn->setPeerAddr(InetAddress(m_curRecvAddr));
		kcpConn->newKCP();
		m_kcpConnections[conv] = kcpConn;
		kcpConn->setKcpConnectionCallback(m_kcpConnectionCallback);
		kcpConn->setKcpMessageCallback(m_kcpMessageCallback);
		kcpConn->setKcpWriteCompleteCallback(m_kcpWriteCompleteCallback);
		kcpConn->setKcpCloseCallback(std::bind(&KcpTcpEventLoop::removeKcpConnectionInLoop, this, std::placeholders::_1, std::placeholders::_2));
		// 映射
		m_addrConns[m_curRecvAddr] = kcpConn;
	}
	checkResponse(ok);
}